

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set.h
# Opt level: O1

const_iterator __thiscall
frozen::
unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
::find<char[2]>(unordered_set<frozen::basic_string<char>,_3UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
                *this,char (*key) [2])

{
  char cVar1;
  long lVar2;
  const_iterator pvVar3;
  
  cVar1 = (*key)[0];
  lVar2 = *(long *)((long)&(this->tables_).first_table_.data_[0].value_ +
                   (ulong)((((uint)(this->tables_).first_seed_ ^ 0x5c5) * 0x193 ^ (int)cVar1) *
                           0x193 >> 5 & 0x38));
  if (lVar2 < 0) {
    lVar2 = *(long *)((long)(this->tables_).second_table_.data_ +
                     (ulong)((((uint)lVar2 ^ 0x5c5) * 0x193 ^ (int)cVar1) * 0x193 >> 5 & 0x38));
  }
  if (((lVar2 == 3) || (pvVar3 = (this->keys_).data_ + lVar2, pvVar3->size_ != 1)) ||
     (*pvVar3->data_ != cVar1)) {
    pvVar3 = (const_iterator)&this->tables_;
  }
  return pvVar3;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    auto const pos = tables_.lookup(key, hash_function());
    auto it = keys_.begin() + pos;
    if (it != keys_.end() && key_eq()(*it, key))
      return it;
    else
      return keys_.end();
  }